

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

bool __thiscall duckdb_shell::ShellState::OpenDatabase(ShellState *this,char **azArg,idx_t nArg)

{
  string *this_00;
  uint8_t uVar1;
  int iVar2;
  char *pcVar3;
  idx_t iVar4;
  bool bVar5;
  char *pcVar6;
  uint uVar7;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (safe_mode == '\x01') {
    OpenDatabase();
    bVar5 = false;
  }
  else {
    close_db(this->db);
    this->db = (sqlite3 *)0x0;
    globalDb = (sqlite3 *)0x0;
    local_48 = 0;
    local_40[0] = 0;
    this_00 = &this->zDbFilename;
    local_50 = local_40;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    this->openMode = '\0';
    uVar7 = this->openFlags & 0xfeffffff;
    this->openFlags = uVar7;
    this->szMax = 0;
    if (1 < nArg) {
      iVar4 = 1;
      uVar1 = '\0';
      bVar5 = false;
      do {
        pcVar3 = azArg[iVar4];
        if (*pcVar3 != '-') break;
        if (pcVar3[1] == '-') {
          pcVar6 = pcVar3 + 2;
        }
        else {
          pcVar6 = pcVar3 + 1;
        }
        iVar2 = strcmp(pcVar6,"new");
        if (iVar2 == 0) {
          bVar5 = true;
        }
        else {
          iVar2 = strcmp(pcVar6,"readonly");
          if (iVar2 == 0) {
            this->openMode = '\x04';
            uVar1 = '\x04';
          }
          else {
            iVar2 = strcmp(pcVar6,"nofollow");
            if (iVar2 != 0) {
              fprintf(_stderr,"unknown option: %s\n",pcVar3);
              return false;
            }
            uVar7 = uVar7 | 0x1000000;
            this->openFlags = uVar7;
          }
        }
        iVar4 = iVar4 + 1;
      } while (nArg != iVar4);
      if (nArg < 2) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = duckdb_shell_sqlite3_mprintf("%s");
        uVar1 = this->openMode;
      }
      if ((pcVar3 != (char *)0x0) || (uVar1 == '\x06')) {
        if (bVar5) {
          unlink(pcVar3);
        }
        pcVar6 = (char *)(this->zDbFilename)._M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar6,(ulong)pcVar3);
        duckdb_shell_sqlite3_free(pcVar3);
        OpenDB(this,1);
        if (this->db != (sqlite3 *)0x0) {
          return true;
        }
        fprintf(_stderr,"Error: cannot open \'%s\'\n",pcVar3);
      }
    }
    bVar5 = true;
    if (this->db == (sqlite3 *)0x0) {
      local_48 = 0;
      local_40[0] = 0;
      local_50 = local_40;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      OpenDB(this,0);
    }
  }
  return bVar5;
}

Assistant:

bool ShellState::OpenDatabase(const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".open cannot be used in -safe mode\n");
		return false;
	}
	char *zNewFilename;   /* Name of the database file to open */
	idx_t iName = 1;      /* Index in azArg[] of the filename */
	bool newFlag = false; /* True to delete file before opening */
	/* Close the existing database */
	close_db(db);
	db = nullptr;
	globalDb = nullptr;
	zDbFilename = string();
	openMode = SHELL_OPEN_UNSPEC;
	openFlags = openFlags & ~(SQLITE_OPEN_NOFOLLOW); // don't overwrite settings loaded in the command line
	szMax = 0;
	/* Check for command-line arguments */
	for (idx_t iName = 1; iName < nArg && azArg[iName][0] == '-'; iName++) {
		const char *z = azArg[iName];
		if (optionMatch(z, "new")) {
			newFlag = true;
		} else if (optionMatch(z, "readonly")) {
			openMode = SHELL_OPEN_READONLY;
		} else if (optionMatch(z, "nofollow")) {
			openFlags |= SQLITE_OPEN_NOFOLLOW;
		} else if (z[0] == '-') {
			utf8_printf(stderr, "unknown option: %s\n", z);
			return false;
		}
	}
	/* If a filename is specified, try to open it first */
	zNewFilename = nArg > iName ? sqlite3_mprintf("%s", azArg[iName]) : 0;
	if (zNewFilename || openMode == SHELL_OPEN_HEXDB) {
		if (newFlag) {
			shellDeleteFile(zNewFilename);
		}
		zDbFilename = zNewFilename;
		sqlite3_free(zNewFilename);
		OpenDB(OPEN_DB_KEEPALIVE);
		if (!db) {
			utf8_printf(stderr, "Error: cannot open '%s'\n", zNewFilename);
		}
	}
	if (!db) {
		/* As a fall-back open a TEMP database */
		zDbFilename = string();
		OpenDB(0);
	}
	return true;
}